

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O2

string_view __thiscall
absl::anon_unknown_5::GenericFind<absl::(anonymous_namespace)::AnyOfPolicy>
          (anon_unknown_5 *this,char *param_2,size_type param_3,char *param_4,size_type param_5)

{
  anon_unknown_5 *paVar1;
  ulong uVar2;
  string_view sVar3;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  if (this == (anon_unknown_5 *)0x0 || param_3 != 0) {
    local_20._M_len = (size_t)this;
    local_20._M_str = param_2;
    paVar1 = (anon_unknown_5 *)
             std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                       (&local_20,param_4,param_5,param_3);
    uVar2 = (ulong)(paVar1 != (anon_unknown_5 *)0xffffffffffffffff);
    if (paVar1 != (anon_unknown_5 *)0xffffffffffffffff) {
      this = paVar1;
    }
    this = this + (long)param_2;
  }
  else {
    this = (anon_unknown_5 *)(param_2 + param_5 + 1);
    uVar2 = 0;
  }
  sVar3._M_str = (char *)this;
  sVar3._M_len = uVar2;
  return sVar3;
}

Assistant:

absl::string_view GenericFind(absl::string_view text,
                              absl::string_view delimiter, size_t pos,
                              FindPolicy find_policy) {
  if (delimiter.empty() && text.length() > 0) {
    // Special case for empty string delimiters: always return a zero-length
    // absl::string_view referring to the item at position 1 past pos.
    return absl::string_view(text.data() + pos + 1, 0);
  }
  size_t found_pos = absl::string_view::npos;
  absl::string_view found(text.data() + text.size(),
                          0);  // By default, not found
  found_pos = find_policy.Find(text, delimiter, pos);
  if (found_pos != absl::string_view::npos) {
    found = absl::string_view(text.data() + found_pos,
                              find_policy.Length(delimiter));
  }
  return found;
}